

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic.cpp
# Opt level: O2

void __thiscall SemanticTables::visit(SemanticTables *this,TypeDeclNode *typeDeclNode)

{
  TypeDeclNode *pTVar1;
  char *lexeme;
  VarDeclNode *pVVar2;
  IdListNode *pIVar3;
  bool bVar4;
  StructSymbol *pSVar5;
  VarSymbol *pVVar6;
  int iVar7;
  IdListNode **ppIVar8;
  VarDeclNode **ppVVar9;
  
  pTVar1 = typeDeclNode->next;
  if (pTVar1 != (TypeDeclNode *)0x0) {
    (*(pTVar1->super_ASTNode)._vptr_ASTNode[3])(pTVar1,this);
  }
  lexeme = (typeDeclNode->id->super_ExpNode).lexeme;
  if (lexeme != (char *)0x0) {
    pSVar5 = StructTable::cSearch(structTable,lexeme);
    if (pSVar5 == (StructSymbol *)0x0) {
      bVar4 = StructTable::cInsert
                        (structTable,(typeDeclNode->id->super_ExpNode).lexeme,typeDeclNode->dec);
      if (bVar4) {
        beginScope((typeDeclNode->id->super_ExpNode).lexeme);
        pVVar2 = typeDeclNode->dec;
        if (pVVar2 != (VarDeclNode *)0x0) {
          (*(pVVar2->super_ASTNode)._vptr_ASTNode[3])(pVVar2,this);
          iVar7 = 0;
          ppVVar9 = &typeDeclNode->dec;
          while (pVVar2 = *ppVVar9, pVVar2 != (VarDeclNode *)0x0) {
            ppIVar8 = &pVVar2->idlist;
            while (pIVar3 = *ppIVar8, pIVar3 != (IdListNode *)0x0) {
              pVVar6 = VarTable::searchInScope
                                 (varTable,(pIVar3->id->super_ExpNode).lexeme,
                                  (typeDeclNode->id->super_ExpNode).lexeme);
              pVVar6->offset = iVar7;
              iVar7 = iVar7 + pVVar6->size;
              ppIVar8 = &pIVar3->next;
            }
            ppVVar9 = &pVVar2->next;
          }
          pSVar5 = StructTable::cSearch(structTable,(typeDeclNode->id->super_ExpNode).lexeme);
          pSVar5->size = iVar7;
        }
        endScope();
        return;
      }
    }
    fprintf(_stderr,"[SEMANTIC ERROR - typeDeclNode] STRUCT ALREADY EXISTS, line: %d, lexeme: %s \n"
            ,(ulong)(uint)(typeDeclNode->super_ASTNode).line,
            (typeDeclNode->id->super_ExpNode).lexeme);
    return;
  }
  fprintf(_stderr,"[SEMANTIC ERROR - typeDeclNode] STRUCT WITHOUT A VALID NAME, line: %d\n",
          (ulong)(uint)(typeDeclNode->super_ASTNode).line);
  return;
}

Assistant:

void SemanticTables::visit(TypeDeclNode *typeDeclNode) {

    if (typeDeclNode->getNext() != NULL) {
        typeDeclNode->getNext()->accept(this);
    }

    if (!typeDeclNode->getId()->getLexeme()) {
        fprintf(stderr, "[SEMANTIC ERROR - typeDeclNode] STRUCT WITHOUT A VALID NAME, line: %d\n",
                typeDeclNode->getLine());
        return;
    }
    if (structTable->cSearch(typeDeclNode->getId()->getLexeme()) ||
        !structTable->cInsert(typeDeclNode->getId()->getLexeme(), typeDeclNode->getDecl())) {
        fprintf(stderr, "[SEMANTIC ERROR - typeDeclNode] STRUCT ALREADY EXISTS, line: %d, lexeme: %s \n",
                typeDeclNode->getLine(), typeDeclNode->getId()->getLexeme());
        return;
    }

    beginScope(typeDeclNode->getId()->getLexeme());
    if (typeDeclNode->getDecl() != NULL) {
        typeDeclNode->getDecl()->accept(this);
        VarDeclNode *varListAux = typeDeclNode->getDecl();
        int totalSizeAux = 0;
        while (varListAux != NULL) {
            IdListNode *idListAux = varListAux->getIdList();
            while (idListAux != NULL) {
                VarSymbol *var = varTable->searchInScope(idListAux->getId()->getLexeme(),
                                                         typeDeclNode->getId()->getLexeme());

                var->setOffset(totalSizeAux);
                totalSizeAux += var->getSize();
                idListAux = idListAux->getNext();
            }
            if (varListAux->getNext()) {
                varListAux = varListAux->getNext();
            } else {
                varListAux = NULL;
            }
        }
        StructSymbol *structSymbol = structTable->cSearch(typeDeclNode->getId()->getLexeme());
        structSymbol->setSize(totalSizeAux);
    }
    endScope();
}